

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::SetShortcutRouting(ImGuiKeyChord key_chord,ImGuiID owner_id,ImGuiInputFlags flags)

{
  ImGuiKeyRoutingData *pIVar1;
  uint uVar2;
  ImGuiWindow *pIVar3;
  int iVar4;
  
  if ((((uint)flags >> 0xd & 1) != 0) && (GImGui->NavWindow == (ImGuiWindow *)0x0)) {
    return false;
  }
  if (((uint)flags >> 0xc & 1) != 0) {
    return true;
  }
  if (((uint)flags >> 8 & 1) == 0) {
    uVar2 = 2;
    if (((uint)flags >> 10 & 1) == 0) {
      uVar2 = (flags << 0x16) >> 0x1f & 0xfe;
    }
  }
  else {
    pIVar3 = GImGui->NavWindow;
    if ((owner_id == 0) || (uVar2 = 1, GImGui->ActiveId != owner_id)) {
      if ((pIVar3 != (ImGuiWindow *)0x0) &&
         (pIVar3->RootWindow == GImGui->CurrentWindow->RootWindow)) {
        iVar4 = -3;
        while (pIVar3 != GImGui->CurrentWindow) {
          if (pIVar3->RootWindow == pIVar3) {
            return false;
          }
          pIVar3 = pIVar3->ParentWindow;
          iVar4 = iVar4 + -1;
          if (pIVar3 == (ImGuiWindow *)0x0) {
            return false;
          }
        }
        if (iVar4 != -0xff) {
          uVar2 = -iVar4;
          goto LAB_001f3af5;
        }
      }
      return false;
    }
  }
LAB_001f3af5:
  pIVar1 = GetShortcutRoutingData(key_chord);
  if (0xfffffffd < owner_id - 1) {
    owner_id = GImGui->CurrentFocusScopeId;
  }
  if (uVar2 < pIVar1->RoutingNextScore) {
    pIVar1->RoutingNext = owner_id;
    pIVar1->RoutingNextScore = (ImU8)uVar2;
  }
  return pIVar1->RoutingCurr == owner_id;
}

Assistant:

bool ImGui::SetShortcutRouting(ImGuiKeyChord key_chord, ImGuiID owner_id, ImGuiInputFlags flags)
{
    ImGuiContext& g = *GImGui;
    if ((flags & ImGuiInputFlags_RouteMask_) == 0)
        flags |= ImGuiInputFlags_RouteGlobalHigh; // IMPORTANT: This is the default for SetShortcutRouting() but NOT Shortcut()
    else
        IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiInputFlags_RouteMask_)); // Check that only 1 routing flag is used

    if (flags & ImGuiInputFlags_RouteUnlessBgFocused)
        if (g.NavWindow == NULL)
            return false;
    if (flags & ImGuiInputFlags_RouteAlways)
        return true;

    const int score = CalcRoutingScore(g.CurrentWindow, owner_id, flags);
    if (score == 255)
        return false;

    // Submit routing for NEXT frame (assuming score is sufficient)
    // FIXME: Could expose a way to use a "serve last" policy for same score resolution (using <= instead of <).
    ImGuiKeyRoutingData* routing_data = GetShortcutRoutingData(key_chord);
    const ImGuiID routing_id = GetRoutingIdFromOwnerId(owner_id);
    //const bool set_route = (flags & ImGuiInputFlags_ServeLast) ? (score <= routing_data->RoutingNextScore) : (score < routing_data->RoutingNextScore);
    if (score < routing_data->RoutingNextScore)
    {
        routing_data->RoutingNext = routing_id;
        routing_data->RoutingNextScore = (ImU8)score;
    }

    // Return routing state for CURRENT frame
    return routing_data->RoutingCurr == routing_id;
}